

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTreeTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  bool bVar1;
  BSTree<int> *this;
  reference piVar2;
  ostream *poVar3;
  BSTNode<int> *pBVar4;
  int *item;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  BSTree<int> *tree;
  allocator<int> local_69;
  int local_68 [10];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> data;
  char **argv_local;
  int argc_local;
  
  local_68[4] = 2;
  local_68[5] = 7;
  local_68[6] = 6;
  local_68[7] = 8;
  local_68[0] = 1;
  local_68[1] = 5;
  local_68[2] = 4;
  local_68[3] = 3;
  local_40 = local_68;
  local_38 = 8;
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  std::allocator<int>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l,&local_69);
  std::allocator<int>::~allocator(&local_69);
  this = (BSTree<int> *)operator_new(8);
  BSTree<int>::BSTree(this);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_30);
  item = (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &item);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    BSTree<int>::insert(this,*piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  BSTree<int>::print(this);
  poVar3 = std::operator<<((ostream *)&std::cout,"====================================");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pBVar4 = BSTree<int>::maxmum(this);
  if (pBVar4 != (BSTNode<int> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"maxmum: ");
    pBVar4 = BSTree<int>::maxmum(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pBVar4->key);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  pBVar4 = BSTree<int>::minimum(this);
  if (pBVar4 != (BSTNode<int> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"minimum: ");
    pBVar4 = BSTree<int>::minimum(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pBVar4->key);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"====================================");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  BSTree<int>::preOrder(this);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"====================================");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  BSTree<int>::inOrder(this);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"====================================");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  BSTree<int>::postOrder(this);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"====================================");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Test seach:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pBVar4 = BSTree<int>::search(this,3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pBVar4->key);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"====================================");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  BSTree<int>::remove(this,(char *)0x5);
  BSTree<int>::print(this);
  if (this != (BSTree<int> *)0x0) {
    BSTree<int>::~BSTree(this);
    operator_delete(this,8);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	vector<int> data = {1, 5, 4, 3, 2, 7, 6, 8};
	BSTree<int>* tree =  new BSTree<int>();

	for (const auto& item : data)
		tree->insert(item);

	tree->print();

	cout << "====================================" << endl;
	if (tree->maxmum() != nullptr)
		cout << "maxmum: " << tree->maxmum()->key << endl;
	if (tree->minimum() != nullptr )
		cout << "minimum: " << tree->minimum()->key << endl;

	cout << "====================================" << endl;
	tree->preOrder();
	cout << endl;
	cout << "====================================" << endl;


	tree->inOrder();
	cout << endl;
	cout << "====================================" << endl;

	tree->postOrder();
	cout << endl;
	cout << "====================================" << endl;

	cout << "Test seach:" << endl;
	cout << tree->search(3)->key<< endl;
	cout << "====================================" << endl;

	tree->remove(5);
	tree->print();

	delete tree;

	return 0;
}